

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O1

GLuint __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::prepareProgram
          (FunctionalTest *this,GLenum target,TextureInternalFormatDescriptor descriptor,
          ColorChannelSelector channel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  GLuint GVar3;
  undefined4 extraout_var;
  long *plVar4;
  undefined4 *puVar5;
  char *pcVar6;
  GLint i;
  GLint i_00;
  char *__end;
  string texel_fetch_arguments_tail;
  string type_name;
  string sampler_prefix;
  string template_verison;
  string local_2b8;
  long *local_298;
  long local_290;
  long local_288 [2];
  long *local_278;
  char *local_270;
  long local_268 [2];
  long *local_258;
  char *local_250;
  long local_248 [2];
  string local_238;
  long *local_218;
  char *local_210;
  long local_208 [2];
  long *local_1f8;
  char *local_1f0;
  long local_1e8 [2];
  FunctionalTest *local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,0x1b32ab9,0x1b32ab9);
  local_258 = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,0x1b32ab9,0x1b32ab9);
  if ((int)target < 0x8c18) {
    if ((int)target < 0x806f) {
      if (target != 0xde0) {
        if (target != 0xde1) {
LAB_0085533d:
          puVar5 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar5 = 0;
          __cxa_throw(puVar5,&int::typeinfo,0);
        }
        pcVar6 = "sampler2D";
        goto LAB_008549d2;
      }
      std::__cxx11::string::_M_replace((ulong)&local_278,0,local_270,0x1af8fcf);
      pcVar6 = "0, 0";
    }
    else if (target == 0x806f) {
      pcVar6 = "sampler3D";
LAB_008549fe:
      std::__cxx11::string::_M_replace((ulong)&local_278,0,local_270,(ulong)pcVar6);
      pcVar6 = "ivec3(0), 0";
    }
    else {
      if (target != 0x84f5) goto LAB_0085533d;
      std::__cxx11::string::_M_replace((ulong)&local_278,0,local_270,0x1af9012);
      pcVar6 = "ivec2(0)";
    }
LAB_00854a1b:
    std::__cxx11::string::_M_replace((ulong)&local_258,0,local_250,(ulong)pcVar6);
  }
  else {
    if ((int)target < 0x9100) {
      if (target != 0x8c18) {
        if (target != 0x8c1a) goto LAB_0085533d;
        pcVar6 = "sampler2DArray";
        goto LAB_008549fe;
      }
      pcVar6 = "sampler1DArray";
LAB_008549d2:
      std::__cxx11::string::_M_replace((ulong)&local_278,0,local_270,(ulong)pcVar6);
      pcVar6 = "ivec2(0), 0";
      goto LAB_00854a1b;
    }
    if (target == 0x9100) {
      std::__cxx11::string::_M_replace((ulong)&local_278,0,local_270,0x1ae821e);
      std::__cxx11::string::_M_replace((ulong)&local_258,0,local_250,0x1b299a2);
      Utilities::itoa_abi_cxx11_(&local_2b8,(Utilities *)(ulong)(this->m_max_samples - 1),i_00);
      std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_2b8._M_dataplus._M_p);
    }
    else {
      if (target != 0x9102) goto LAB_0085533d;
      std::__cxx11::string::_M_replace((ulong)&local_278,0,local_270,0x1ae8232);
      std::__cxx11::string::_M_replace((ulong)&local_258,0,local_250,0x1a356cb);
      Utilities::itoa_abi_cxx11_(&local_2b8,(Utilities *)(ulong)(this->m_max_samples - 1),i);
      std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_2b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8);
  switch(channel) {
  case RED_COMPONENT:
    pcVar6 = ".r";
    break;
  case GREEN_COMPONENT:
    pcVar6 = ".g";
    break;
  case BLUE_COMPONENT:
    pcVar6 = ".b";
    break;
  case ALPHA_COMPONENT:
    pcVar6 = ".a";
    break;
  case COMPONENTS_COUNT:
    goto switchD_00854a5f_caseD_4;
  default:
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_2b8,0,(char *)local_2b8._M_string_length,(ulong)pcVar6);
switchD_00854a5f_caseD_4:
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,0x1b32ab9);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,0x1b32ab9);
  if ((((((descriptor.expected_alpha_type == 0x1406 || descriptor.expected_blue_type == 0x1406) ||
          (descriptor.expected_green_type == 0x1406 || descriptor.expected_red_type == 0x1406)) ||
        ((descriptor.expected_alpha_type == 0x8f9c || descriptor.expected_blue_type == 0x8f9c) ||
         (descriptor.expected_green_type == 0x8f9c || descriptor.expected_red_type == 0x8f9c))) ||
       (descriptor.expected_red_type == 0x8c17)) ||
      ((descriptor.expected_green_type == 0x8c17 || (descriptor.expected_blue_type == 0x8c17)))) ||
     ((descriptor.expected_alpha_type == 0x8c17 ||
      ((descriptor.expected_depth_type != 0 || (0 < descriptor.min_stencil_size)))))) {
    pcVar6 = "float";
    if (channel == COMPONENTS_COUNT) {
      pcVar6 = "vec4";
    }
    std::__cxx11::string::_M_replace((ulong)&local_218,0,local_210,(ulong)pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_1f8,0,local_1f0,0x1b32ab9);
  }
  else {
    if ((descriptor.expected_alpha_type == 0x1404 || descriptor.expected_blue_type == 0x1404) ||
        (descriptor.expected_green_type == 0x1404 || descriptor.expected_red_type == 0x1404)) {
      pcVar6 = "int";
      if (channel == COMPONENTS_COUNT) {
        pcVar6 = "ivec4";
      }
      std::__cxx11::string::operator=((string *)&local_218,pcVar6);
      pcVar6 = "i";
    }
    else {
      pcVar6 = "uint";
      if (channel == COMPONENTS_COUNT) {
        pcVar6 = "uvec4";
      }
      std::__cxx11::string::operator=((string *)&local_218,pcVar6);
      pcVar6 = "u";
    }
    std::__cxx11::string::operator=((string *)&local_1f8,pcVar6);
  }
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"#version 150","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,s_fragment_shader_template,(allocator<char> *)&local_238);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_298,(long)local_298 + local_290);
  local_1d8 = this;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"TEMPLATE_TYPE","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_218,local_210 + (long)local_218);
  Utilities::preprocessString(&local_238,&local_50,&local_70,&local_90);
  std::__cxx11::string::operator=((string *)&local_298,(string *)&local_238);
  paVar1 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_298,(long)local_298 + local_290);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"TEMPLATE_SAMPLER","");
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_278);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,*plVar4,plVar4[1] + *plVar4);
  Utilities::preprocessString(&local_238,&local_b0,&local_d0,&local_f0);
  std::__cxx11::string::operator=((string *)&local_298,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_298,(long)local_298 + local_290);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"TEMPLATE_TEXEL_FETCH_ARGUMENTS","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_258,local_250 + (long)local_258);
  Utilities::preprocessString(&local_238,&local_110,&local_130,&local_150);
  std::__cxx11::string::operator=((string *)&local_298,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_298,(long)local_298 + local_290);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"TEMPLATE_COMPONENT","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_2b8._M_dataplus._M_p,
             (char *)(local_2b8._M_string_length + (long)local_2b8._M_dataplus._M_p));
  Utilities::preprocessString(&local_238,&local_170,&local_190,&local_1b0);
  std::__cxx11::string::operator=((string *)&local_298,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  GVar3 = Utilities::buildProgram
                    ((Functions *)CONCAT44(extraout_var,iVar2),
                     ((local_1d8->super_TestCase).m_context)->m_testCtx->m_log,s_vertex_shader_code,
                     (GLchar *)local_298);
  if (GVar3 == 0) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  return GVar3;
}

Assistant:

glw::GLuint FunctionalTest::prepareProgram(glw::GLenum target, TextureInternalFormatDescriptor descriptor,
										   ColorChannelSelector channel)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Preparing sampler name and textelFetch arguments */
	std::string sampler_name			   = "";
	std::string texel_fetch_arguments_tail = "";

	switch (target)
	{
	case GL_TEXTURE_1D:
		sampler_name			   = "sampler1D";
		texel_fetch_arguments_tail = "0, 0";
		break;
	case GL_TEXTURE_2D:
		sampler_name			   = "sampler2D";
		texel_fetch_arguments_tail = "ivec2(0), 0";
		break;
	case GL_TEXTURE_1D_ARRAY:
		sampler_name			   = "sampler1DArray";
		texel_fetch_arguments_tail = "ivec2(0), 0";
		break;
	case GL_TEXTURE_RECTANGLE:
		sampler_name			   = "sampler2DRect";
		texel_fetch_arguments_tail = "ivec2(0)";
		break;
	case GL_TEXTURE_2D_ARRAY:
		sampler_name			   = "sampler2DArray";
		texel_fetch_arguments_tail = "ivec3(0), 0";
		break;
	case GL_TEXTURE_3D:
		sampler_name			   = "sampler3D";
		texel_fetch_arguments_tail = "ivec3(0), 0";
		break;
	case GL_TEXTURE_2D_MULTISAMPLE:
		sampler_name			   = "sampler2DMS";
		texel_fetch_arguments_tail = "ivec2(0), ";
		texel_fetch_arguments_tail.append(Utilities::itoa(m_max_samples - 1));
		break;
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		sampler_name			   = "sampler2DMSArray";
		texel_fetch_arguments_tail = "ivec3(0), ";
		texel_fetch_arguments_tail.append(Utilities::itoa(m_max_samples - 1));
		break;
	default:
		throw 0;
	}

	/* Preparing component selector name */
	std::string component_name = "";

	switch (channel)
	{
	case RED_COMPONENT:
		component_name = ".r";
		break;
	case GREEN_COMPONENT:
		component_name = ".g";
		break;
	case BLUE_COMPONENT:
		component_name = ".b";
		break;
	case ALPHA_COMPONENT:
		component_name = ".a";
		break;
	case COMPONENTS_COUNT:
		break;
	default:
		throw 0;
	}

	/* Preparing output type name and sampler prefix */
	std::string type_name	  = "";
	std::string sampler_prefix = "";

	if (isFloatType(descriptor) || isFixedSignedType(descriptor) || isFixedUnsignedType(descriptor) ||
		isDepthType(descriptor) || isStencilType(descriptor))
	{
		if (channel == COMPONENTS_COUNT)
		{
			type_name = "vec4";
		}
		else
		{
			type_name = "float";
		}
		sampler_prefix = "";
	}
	else
	{
		if (isIntegerSignedType(descriptor))
		{
			if (channel == COMPONENTS_COUNT)
			{
				type_name = "ivec4";
			}
			else
			{
				type_name = "int";
			}
			sampler_prefix = "i";
		}
		else
		{
			if (channel == COMPONENTS_COUNT)
			{
				type_name = "uvec4";
			}
			else
			{
				type_name = "uint";
			}
			sampler_prefix = "u";
		}
	}

	std::string template_verison = "#version 150";

	/* Preprocessing fragment shader source code. */
	std::string fragment_shader = s_fragment_shader_template;

	fragment_shader = Utilities::preprocessString(fragment_shader, "TEMPLATE_TYPE", type_name);
	fragment_shader =
		Utilities::preprocessString(fragment_shader, "TEMPLATE_SAMPLER", sampler_prefix.append(sampler_name));
	fragment_shader =
		Utilities::preprocessString(fragment_shader, "TEMPLATE_TEXEL_FETCH_ARGUMENTS", texel_fetch_arguments_tail);
	fragment_shader = Utilities::preprocessString(fragment_shader, "TEMPLATE_COMPONENT", component_name);

	/* Building program. */
	glw::GLuint program =
		Utilities::buildProgram(gl, m_context.getTestContext().getLog(), s_vertex_shader_code, fragment_shader.c_str());

	if (0 == program)
	{
		throw 0;
	}

	/* Return program name. */
	return program;
}